

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifcvtstr(bifcxdef *ctx,_func_void_uchar_ptr_int *cvtfn,int argc)

{
  ushort uVar1;
  runsdef *prVar2;
  runcxdef *ctx_00;
  uint uVar3;
  runsdef stkval;
  runsdef val;
  runsdef local_40;
  runsdef local_30;
  
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar2[-1].runstyp == '\x03') {
    local_40.runsv = (anon_union_8_4_1dda36f5_for_runsv)(ctx_00->runcxsp->runsv).runsvstr;
    local_40.runstyp = '\x03';
    uVar1 = *(ushort *)local_40.runsv.runsvstr;
    if ((uint)(*(int *)&ctx_00->runcxhtop - *(int *)&ctx_00->runcxhp) <= (uint)uVar1) {
      runhcmp(ctx_00,(uint)uVar1,1,&local_40,(runsdef *)0x0,(runsdef *)0x0);
    }
    uVar3 = (uint)uVar1;
    memcpy(ctx->bifcxrun->runcxhp,local_40.runsv.runsvstr,(ulong)uVar3);
    (*cvtfn)(ctx->bifcxrun->runcxhp + 2,uVar3 - 2);
    local_30.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
    local_30.runstyp = '\x03';
    ctx->bifcxrun->runcxhp = local_30.runsv.runsvstr + uVar3;
    runrepush(ctx->bifcxrun,&local_30);
    return;
  }
  ctx_00->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3ef);
}

Assistant:

static void bifcvtstr(bifcxdef *ctx, void (*cvtfn)(uchar *, int), int argc)
{
    uchar   *p;
    int      len;
    runsdef  val;
    runsdef  stkval;
    
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_SSTRING);
    
    p = runpopstr(ctx->bifcxrun);
    stkval.runstyp = DAT_SSTRING;
    stkval.runsv.runsvstr = p;
    len = osrp2(p);
    
    /* allocate space in heap for the string and convert */
    runhres1(ctx->bifcxrun, len, 1, &stkval);
    p = stkval.runsv.runsvstr;
    memcpy(ctx->bifcxrun->runcxhp, p, (size_t)len);
    (*cvtfn)(ctx->bifcxrun->runcxhp + 2, len - 2);
    
    val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
    val.runstyp = DAT_SSTRING;
    ctx->bifcxrun->runcxhp += len;
    runrepush(ctx->bifcxrun, &val);
}